

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_xor.c
# Opt level: O0

_Bool array_bitset_container_xor
                (array_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  bool bVar1;
  bitset_container_t *dest;
  uint64_t uVar2;
  array_container_t *paVar3;
  bitset_container_t *in_RDX;
  int *in_RDI;
  bitset_container_t *result;
  
  dest = bitset_container_create();
  bitset_container_copy(in_RDX,dest);
  uVar2 = bitset_flip_list_withcard
                    (dest->words,(long)dest->cardinality,*(uint16_t **)(in_RDI + 2),(long)*in_RDI);
  dest->cardinality = (int32_t)uVar2;
  bVar1 = 0x1000 < dest->cardinality;
  if (bVar1) {
    *(bitset_container_t **)in_RDX = dest;
  }
  else {
    paVar3 = array_container_from_bitset(in_RDX);
    *(array_container_t **)in_RDX = paVar3;
    bitset_container_free((bitset_container_t *)0x1838c0);
  }
  return bVar1;
}

Assistant:

bool array_bitset_container_xor(const array_container_t *src_1,
                                const bitset_container_t *src_2,
                                container_t **dst) {
    bitset_container_t *result = bitset_container_create();
    bitset_container_copy(src_2, result);
    result->cardinality = (int32_t)bitset_flip_list_withcard(
        result->words, result->cardinality, src_1->array, src_1->cardinality);

    // do required type conversions.
    if (result->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(result);
        bitset_container_free(result);
        return false;  // not bitset
    }
    *dst = result;
    return true;  // bitset
}